

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_misc.c
# Opt level: O2

int wrterr(FILE *out,char *mess,int severity)

{
  int iVar1;
  
  if (severity < err_report) {
    ffcmsg();
    iVar1 = 0;
  }
  else {
    iVar1 = nerrs + 1;
    builtin_strncpy(temp,"*** Error:   ",0xe);
    nerrs = iVar1;
    strcat(temp,mess);
    if (out != (FILE *)0x0) {
      if (_stderr != (FILE *)out && _stdout != out) {
        print_fmt(out,temp,0xd);
      }
      print_fmt((FILE *)_stderr,temp,0xd);
      iVar1 = nerrs;
    }
    if (200 < iVar1) {
      fwrite("??? Too many Errors! I give up...\n",0x22,1,_stderr);
      close_report(out);
      exit(1);
    }
    ffcmsg();
    iVar1 = nerrs;
  }
  return iVar1;
}

Assistant:

int wrterr(FILE *out, char *mess, int severity )
{

    if(severity < err_report) { 
        fits_clear_errmsg();
        return 0; 
    }
    nerrs++;

    strcpy(temp,"*** Error:   ");
    strcat(temp,mess);
    if(out != NULL) {
         if ((out!=stdout) && (out!=stderr)) print_fmt(out,temp,13);
/*
   if ERR2OUT is defined, then error messages will be sent to the
   stdout stream rather than to stderr
*/
#ifdef ERR2OUT
         print_fmt(stdout,temp,13);
#else
         print_fmt(stderr,temp,13);
#endif
    }

    if(nerrs > MAXERRORS ) { 

#ifdef ERR2OUT
	 fprintf(stdout,"??? Too many Errors! I give up...\n");
#else
	 fprintf(stderr,"??? Too many Errors! I give up...\n");
#endif
         close_report(out);
         exit(1);
    }
    fits_clear_errmsg();
    return nerrs;
}